

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

void xmlXPtrErr(xmlXPathParserContextPtr ctxt,int code,char *msg,xmlChar *extra)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  xmlChar *pxVar3;
  int iVar4;
  void *data;
  xmlStructuredErrorFunc schannel;
  xmlNodePtr node;
  
  if (ctxt->error == 0) {
    ctxt->error = code;
    pxVar1 = ctxt->context;
    if (pxVar1 == (xmlXPathContextPtr)0x0) {
      pxVar3 = ctxt->base;
      iVar4 = *(int *)&ctxt->cur - (int)pxVar3;
      node = (xmlNode *)0x0;
      data = (void *)0x0;
      schannel = (xmlStructuredErrorFunc)0x0;
    }
    else {
      xmlResetError(&pxVar1->lastError);
      (pxVar1->lastError).domain = 0xd;
      (pxVar1->lastError).code = code;
      (pxVar1->lastError).level = XML_ERR_ERROR;
      pxVar3 = xmlStrdup(ctxt->base);
      (pxVar1->lastError).str1 = (char *)pxVar3;
      if (pxVar3 == (xmlChar *)0x0) goto LAB_001bac45;
      pxVar3 = ctxt->base;
      iVar4 = *(int *)&ctxt->cur - (int)pxVar3;
      (pxVar1->lastError).int1 = iVar4;
      pxVar2 = ctxt->context;
      node = pxVar2->debugNode;
      (pxVar1->lastError).node = node;
      data = pxVar2->userData;
      schannel = pxVar2->error;
    }
    iVar4 = xmlRaiseError(schannel,(xmlGenericErrorFunc)0x0,data,(void *)0x0,node,0xd,code,
                          XML_ERR_ERROR,(char *)0x0,0,(char *)extra,(char *)pxVar3,(char *)0x0,iVar4
                          ,0,msg,extra);
    if (iVar4 < 0) {
LAB_001bac45:
      xmlXPathPErrMemory(ctxt);
      return;
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlXPtrErr(xmlXPathParserContextPtr ctxt, int code,
           const char * msg, const xmlChar *extra)
{
    xmlStructuredErrorFunc serror = NULL;
    void *data = NULL;
    xmlNodePtr node = NULL;
    int res;

    if (ctxt == NULL)
        return;
    /* Only report the first error */
    if (ctxt->error != 0)
        return;

    ctxt->error = code;

    if (ctxt->context != NULL) {
        xmlErrorPtr err = &ctxt->context->lastError;

        /* cleanup current last error */
        xmlResetError(err);

        err->domain = XML_FROM_XPOINTER;
        err->code = code;
        err->level = XML_ERR_ERROR;
        err->str1 = (char *) xmlStrdup(ctxt->base);
        if (err->str1 == NULL) {
            xmlXPathPErrMemory(ctxt);
            return;
        }
        err->int1 = ctxt->cur - ctxt->base;
        err->node = ctxt->context->debugNode;

        serror = ctxt->context->error;
        data = ctxt->context->userData;
        node = ctxt->context->debugNode;
    }